

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

void Lf_ManComputeSwitching(Gia_Man_t *p,Vec_Flt_t *vSwitches)

{
  float *pfVar1;
  int iVar2;
  Vec_Int_t *__ptr;
  
  __ptr = Gia_ManComputeSwitchProbs(p,0x30,0x10,0);
  if (vSwitches->nCap != 0) {
    __assert_fail("Vec_FltCap(vSwitches) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x150,"void Lf_ManComputeSwitching(Gia_Man_t *, Vec_Flt_t *)");
  }
  iVar2 = __ptr->nSize;
  pfVar1 = (float *)__ptr->pArray;
  vSwitches->nCap = __ptr->nCap;
  vSwitches->nSize = iVar2;
  vSwitches->pArray = pfVar1;
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Lf_ManComputeSwitching( Gia_Man_t * p, Vec_Flt_t * vSwitches )
{
//    abctime clk = Abc_Clock();
    Vec_Flt_t * vSwitching = (Vec_Flt_t *)Gia_ManComputeSwitchProbs( p, 48, 16, 0 );
    assert( Vec_FltCap(vSwitches) == 0 );
    *vSwitches = *vSwitching;
    ABC_FREE( vSwitching );
//    Abc_PrintTime( 1, "Computing switching activity", Abc_Clock() - clk );
}